

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O0

int lws_b64_decode_string(char *in,char *out,int out_size)

{
  size_t sVar1;
  int out_size_local;
  char *out_local;
  char *in_local;
  
  sVar1 = _lws_b64_decode_string(in,-1,out,out_size);
  return (int)sVar1;
}

Assistant:

static size_t
_lws_b64_decode_string(const char *in, int in_len, char *out, int out_size)
{
	struct lws_b64state state;
	size_t il = (size_t)in_len, ol = out_size;

	if (in_len == -1)
		il = strlen(in);

	lws_b64_decode_state_init(&state);
	lws_b64_decode_stateful(&state, in, &il, (uint8_t *)out, &ol, 1);

	if (!il)
		return 0;

	return ol;
}